

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall mp::BinaryReadError::~BinaryReadError(BinaryReadError *this)

{
  BinaryReadError *in_RDI;
  
  ~BinaryReadError(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

~BinaryReadError() throw() {}